

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

RPCHelpMan * wallet::listlockunspent(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff6b8;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f0;
  allocator<char> *in_stack_fffffffffffff6f8;
  iterator in_stack_fffffffffffff700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff708;
  undefined1 in_stack_fffffffffffff71f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff720;
  string *in_stack_fffffffffffff728;
  undefined1 *puVar2;
  RPCResult *in_stack_fffffffffffff730;
  RPCResults *in_stack_fffffffffffff738;
  RPCResult *in_stack_fffffffffffff740;
  undefined1 *local_8b8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  RPCHelpMan *name;
  RPCHelpMan *this_00;
  undefined1 local_778 [37];
  allocator<char> local_753;
  allocator<char> local_752;
  allocator<char> local_751;
  allocator<char> local_750;
  allocator<char> local_74f;
  allocator<char> local_74e;
  allocator<char> local_74d;
  allocator<char> local_74c;
  allocator<char> local_74b [3];
  pointer local_748;
  pointer pRStack_740;
  undefined8 local_738;
  allocator<char> local_72a;
  allocator<char> local_729;
  size_type local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_720;
  allocator<char> local_702;
  allocator<char> local_701 [31];
  allocator<char> local_6e2;
  allocator<char> local_6e1;
  RPCMethodImpl *in_stack_fffffffffffff920;
  undefined1 local_6c2;
  RPCResults local_6c1;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  vector<RPCArg,_std::allocator<RPCArg>_> local_68a [38];
  undefined1 local_2e8 [272];
  undefined1 local_1d8 [64];
  undefined1 local_198 [136];
  undefined1 local_110 [264];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (RPCHelpMan *)
            ((long)&local_68a[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start + 1);
  name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  args = local_68a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_6a8 = 0;
  uStack_6a0 = 0;
  local_698 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6b8);
  results = &local_6c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  examples = (RPCExamples *)&local_6c2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_728 = 0;
  aStack_720._M_allocated_capacity = 0;
  aStack_720._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,(Type)((ulong)in_stack_fffffffffffff738 >> 0x20),
             (string *)in_stack_fffffffffffff730,in_stack_fffffffffffff728,in_stack_fffffffffffff720
             ,(bool)in_stack_fffffffffffff71f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_748 = (pointer)0x0;
  pRStack_740 = (pointer)0x0;
  local_738._0_1_ = false;
  local_738._1_1_ = false;
  local_738._2_6_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,(Type)((ulong)in_stack_fffffffffffff738 >> 0x20),
             (string *)in_stack_fffffffffffff730,in_stack_fffffffffffff728,in_stack_fffffffffffff720
             ,(bool)in_stack_fffffffffffff71f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff6b8);
  __l._M_len = (size_type)in_stack_fffffffffffff708;
  __l._M_array = in_stack_fffffffffffff700;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6f8,__l,
             (allocator_type *)in_stack_fffffffffffff6f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,(Type)((ulong)in_stack_fffffffffffff738 >> 0x20),
             (string *)in_stack_fffffffffffff730,in_stack_fffffffffffff728,in_stack_fffffffffffff720
             ,(bool)in_stack_fffffffffffff71f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff6b8);
  __l_00._M_len = (size_type)in_stack_fffffffffffff708;
  __l_00._M_array = in_stack_fffffffffffff700;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6f8,__l_00,
             (allocator_type *)in_stack_fffffffffffff6f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,(Type)((ulong)in_stack_fffffffffffff738 >> 0x20),
             (string *)in_stack_fffffffffffff730,in_stack_fffffffffffff728,in_stack_fffffffffffff720
             ,(bool)in_stack_fffffffffffff71f);
  RPCResults::RPCResults(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleCli(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+((char *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  std::operator+(in_stack_fffffffffffff6d0,(char *)in_stack_fffffffffffff6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleCli(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6d0,(char *)in_stack_fffffffffffff6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleCli(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6d0,(char *)in_stack_fffffffffffff6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleCli(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6d0,(char *)in_stack_fffffffffffff6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleRpc(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff6b8,(string *)0xc5ca0a);
  this = (RPCResult *)local_778;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listlockunspent()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
  RPCHelpMan::RPCHelpMan
            (this_00,&name->m_name,&in_RDI->m_name,args,results,examples,in_stack_fffffffffffff920);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_778 + 0x24));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_753);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_752);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_751);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_750);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_74f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_74e);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_74d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_74c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_74b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_198;
  local_8b8 = local_110;
  do {
    local_8b8 = local_8b8 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_8b8 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_2e8;
  puVar1 = local_1d8;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult(this);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_72a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_729);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_702);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_701);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6e2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6e1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_68a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&local_68a[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_start + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return name;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listlockunspent()
{
    return RPCHelpMan{"listlockunspent",
                "\nReturns list of temporarily unspendable outputs.\n"
                "See the lockunspent call to lock and unlock transactions for spending.\n",
                {},
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR_HEX, "txid", "The transaction id locked"},
                            {RPCResult::Type::NUM, "vout", "The vout value"},
                        }},
                    }
                },
                RPCExamples{
            "\nList the unspent transactions\n"
            + HelpExampleCli("listunspent", "") +
            "\nLock an unspent transaction\n"
            + HelpExampleCli("lockunspent", "false \"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":1}]\"") +
            "\nList the locked transactions\n"
            + HelpExampleCli("listlockunspent", "") +
            "\nUnlock the transaction again\n"
            + HelpExampleCli("lockunspent", "true \"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":1}]\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("listlockunspent", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    std::vector<COutPoint> vOutpts;
    pwallet->ListLockedCoins(vOutpts);

    UniValue ret(UniValue::VARR);

    for (const COutPoint& outpt : vOutpts) {
        UniValue o(UniValue::VOBJ);

        o.pushKV("txid", outpt.hash.GetHex());
        o.pushKV("vout", (int)outpt.n);
        ret.push_back(std::move(o));
    }

    return ret;
},
    };
}